

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primetest.cpp
# Opt level: O2

bool witness(int a,int n)

{
  undefined1 auVar1 [16];
  uint n_00;
  int64_t iVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 1;
  n_00 = n;
  do {
    n_00 = (int)n_00 / 2;
    iVar4 = iVar4 + 1;
  } while ((n_00 & 1) == 0);
  iVar2 = power(a,n_00,n);
  do {
    lVar3 = iVar2;
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      return lVar3 != 1;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = lVar3 * lVar3;
    iVar2 = SUB168(auVar1 % SEXT816((long)n),0);
  } while (((lVar3 == 1) || (iVar2 != 1)) || (lVar3 == n + -1));
  return true;
}

Assistant:

bool witness(int a, int n)
{
	int t, u, i;
	int64_t prev, curr;

	u = n / 2;
	t = 1;
	while (!(u & 1))
	{
		u /= 2;
		++t;
	}

	prev = power(a, u, n);
	for (i = 1; i <= t; ++i)
	{
		curr = (prev*prev) % n;
		if ((curr == 1) && (prev != 1) && (prev != n - 1))
			return true;
		prev = curr;
	}
	if (curr != 1)
		return true;
	return false;
}